

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

int cmcmd_cmake_ninja_dyndep(const_iterator argBeg,const_iterator argEnd)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  cmFileSetVisibility cVar3;
  ulong uVar4;
  char *pcVar5;
  Value *pVVar6;
  reference this;
  mapped_type *pmVar7;
  cmGlobalNinjaGenerator *this_00;
  string_view sVar8;
  const_iterator cVar9;
  allocator<char> local_1659;
  string local_1658 [32];
  undefined1 local_1638 [8];
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> ggd;
  cmake cm;
  Value *tdi_fs_dest;
  string_view local_d70;
  String local_d60;
  String local_d40;
  String local_d20;
  String local_d00;
  reference local_ce0;
  Value *tdi_cxx_module_info;
  String local_cb0;
  mapped_type *local_c90;
  CxxModuleFileSet *fsi;
  undefined1 local_c80;
  SelfType local_c78;
  _Base_ptr local_c68;
  undefined1 local_c60;
  undefined1 local_c58 [8];
  const_iterator i;
  Value *tdi_cxx_modules;
  String local_c20;
  String local_c00;
  String local_be0;
  String local_bc0;
  undefined1 local_ba0 [8];
  CxxModuleBmiInstall bmi_install;
  Value *bmi_installation;
  String local_ad0;
  String local_ab0;
  String local_a90;
  String local_a70;
  undefined1 local_a50 [8];
  CxxModuleExport exp;
  Value *tdi_export;
  undefined1 local_990 [8];
  const_iterator __end2_1;
  undefined1 local_970 [8];
  const_iterator __begin2_1;
  Value *__range2_1;
  Value *tdi_exports;
  undefined1 local_930 [8];
  CxxModuleExportInfo export_info;
  Value *tdi_linked_target_dir;
  undefined1 local_7e0 [8];
  const_iterator __end2;
  undefined1 local_7c0 [8];
  const_iterator __begin2;
  Value *__range2;
  Value *tdi_linked_target_dirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linked_target_dirs;
  undefined1 local_778 [8];
  string module_dir;
  string dir_top_src;
  string dir_top_bld;
  string dir_cur_src;
  string dir_cur_bld;
  cmAlphaNum local_6b8;
  cmAlphaNum local_688;
  string local_658;
  undefined1 local_638 [8];
  Reader reader;
  ifstream tdif;
  Value *tdi;
  Value tdio;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  uint local_274;
  cmAlphaNum local_270;
  cmAlphaNum local_240;
  string local_210;
  string_view local_1f0;
  string_view local_1e0;
  string local_1d0 [32];
  string_view local_1b0;
  string local_1a0 [32];
  string_view local_180;
  string local_170 [32];
  string_view local_150;
  string local_140 [48];
  string_view local_110;
  reference local_100;
  string *arg;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_ddis;
  string arg_modmapfmt;
  string arg_tdi;
  string arg_lang;
  string arg_dd;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_full;
  const_iterator argEnd_local;
  const_iterator argBeg_local;
  
  arg_full.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = argEnd._M_current;
  cmSystemTools::HandleResponseFile
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38,argBeg,argEnd);
  std::__cxx11::string::string((string *)(arg_lang.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(arg_tdi.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(arg_modmapfmt.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &arg_ddis.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38);
  arg = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&arg);
    if (!bVar1) break;
    local_100 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    sVar8 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_100);
    local_110 = sVar8;
    bVar1 = cmHasLiteralPrefix<7ul>(sVar8,(char (*) [7])0xc7eed5);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)local_140,(ulong)local_100);
      std::__cxx11::string::operator=((string *)(arg_modmapfmt.field_2._M_local_buf + 8),local_140);
      std::__cxx11::string::~string(local_140);
    }
    else {
      sVar8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_100);
      local_150 = sVar8;
      bVar1 = cmHasLiteralPrefix<8ul>(sVar8,(char (*) [8])0xc7def3);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)local_170,(ulong)local_100);
        std::__cxx11::string::operator=((string *)(arg_tdi.field_2._M_local_buf + 8),local_170);
        std::__cxx11::string::~string(local_170);
      }
      else {
        sVar8 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_100);
        local_180 = sVar8;
        bVar1 = cmHasLiteralPrefix<6ul>(sVar8,(char (*) [6])0xc7df24);
        if (bVar1) {
          std::__cxx11::string::substr((ulong)local_1a0,(ulong)local_100);
          std::__cxx11::string::operator=((string *)(arg_lang.field_2._M_local_buf + 8),local_1a0);
          std::__cxx11::string::~string(local_1a0);
        }
        else {
          sVar8 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_100);
          local_1b0 = sVar8;
          bVar1 = cmHasLiteralPrefix<13ul>(sVar8,(char (*) [13])0xc7eeb1);
          if (!bVar1) {
            sVar8 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_100);
            local_1e0 = sVar8;
            bVar1 = cmHasLiteralPrefix<3ul>(sVar8,(char (*) [3])0xca04ae);
            if (!bVar1) {
              sVar8 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_100);
              local_1f0 = sVar8;
              bVar1 = cmHasLiteralSuffix<5ul>(sVar8,(char (*) [5])".ddi");
              if (bVar1) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&__range1,local_100);
                goto LAB_005d24fa;
              }
            }
            cmAlphaNum::cmAlphaNum(&local_240,"-E cmake_ninja_dyndep unknown argument: ");
            cmAlphaNum::cmAlphaNum(&local_270,local_100);
            cmStrCat<>(&local_210,&local_240,&local_270);
            cmSystemTools::Error(&local_210);
            std::__cxx11::string::~string((string *)&local_210);
            argBeg_local._M_current._4_4_ = 1;
            local_274 = 1;
            goto LAB_005d3bc1;
          }
          std::__cxx11::string::substr((ulong)local_1d0,(ulong)local_100);
          std::__cxx11::string::operator=
                    ((string *)
                     &arg_ddis.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_1d0);
          std::__cxx11::string::~string(local_1d0);
        }
      }
    }
LAB_005d24fa:
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"-E cmake_ninja_dyndep requires value for --tdi=",&local_299);
    cmSystemTools::Error(&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
    argBeg_local._M_current._4_4_ = 1;
    local_274 = 1;
    goto LAB_005d3bc1;
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"-E cmake_ninja_dyndep requires value for --lang=",&local_2c1);
    cmSystemTools::Error(&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    argBeg_local._M_current._4_4_ = 1;
    local_274 = 1;
    goto LAB_005d3bc1;
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,"-E cmake_ninja_dyndep requires value for --dd=",
               (allocator<char> *)((long)&tdio.limit_ + 7));
    cmSystemTools::Error(&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&tdio.limit_ + 7));
    argBeg_local._M_current._4_4_ = 1;
    local_274 = 1;
    goto LAB_005d3bc1;
  }
  Json::Value::Value((Value *)&tdi,nullValue);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(&reader.features_,pcVar5,_Var2);
  Json::Reader::Reader((Reader *)local_638);
  bVar1 = Json::Reader::parse((Reader *)local_638,(istream *)&reader.features_,(Value *)&tdi,false);
  if (!bVar1) {
    cmAlphaNum::cmAlphaNum(&local_688,"-E cmake_ninja_dyndep failed to parse ");
    cmAlphaNum::cmAlphaNum(&local_6b8,(string *)((long)&arg_modmapfmt.field_2 + 8));
    Json::Reader::getFormattedErrorMessages_abi_cxx11_
              ((String *)((long)&dir_cur_bld.field_2 + 8),(Reader *)local_638);
    cmStrCat<std::__cxx11::string>
              (&local_658,&local_688,&local_6b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&dir_cur_bld.field_2 + 8));
    cmSystemTools::Error(&local_658);
    std::__cxx11::string::~string((string *)&local_658);
    std::__cxx11::string::~string((string *)(dir_cur_bld.field_2._M_local_buf + 8));
    argBeg_local._M_current._4_4_ = 1;
  }
  local_274 = (uint)!bVar1;
  Json::Reader::~Reader((Reader *)local_638);
  std::ifstream::~ifstream(&reader.features_);
  if (local_274 == 0) {
    pVVar6 = Json::Value::operator[]((Value *)&tdi,"dir-cur-bld");
    Json::Value::asString_abi_cxx11_((String *)((long)&dir_cur_src.field_2 + 8),pVVar6);
    pVVar6 = Json::Value::operator[]((Value *)&tdi,"dir-cur-src");
    Json::Value::asString_abi_cxx11_((String *)((long)&dir_top_bld.field_2 + 8),pVVar6);
    pVVar6 = Json::Value::operator[]((Value *)&tdi,"dir-top-bld");
    Json::Value::asString_abi_cxx11_((String *)((long)&dir_top_src.field_2 + 8),pVVar6);
    pVVar6 = Json::Value::operator[]((Value *)&tdi,"dir-top-src");
    Json::Value::asString_abi_cxx11_((String *)((long)&module_dir.field_2 + 8),pVVar6);
    pVVar6 = Json::Value::operator[]((Value *)&tdi,"module-dir");
    Json::Value::asString_abi_cxx11_((String *)local_778,pVVar6);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      sVar8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_778);
      linked_target_dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)sVar8._M_len;
      bVar1 = cmHasLiteralSuffix<2ul>(sVar8,(char (*) [2])0xcb8242);
      if (!bVar1) {
        std::__cxx11::string::operator+=((string *)local_778,'/');
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&tdi_linked_target_dirs);
    pVVar6 = Json::Value::operator[]((Value *)&tdi,"linked-target-dirs");
    bVar1 = Json::Value::isArray(pVVar6);
    if (bVar1) {
      __begin2.super_ValueIteratorBase._8_8_ = pVVar6;
      cVar9 = Json::Value::begin(pVVar6);
      __end2.super_ValueIteratorBase._8_8_ = cVar9.super_ValueIteratorBase.current_._M_node;
      __begin2.super_ValueIteratorBase.current_._M_node._0_1_ =
           cVar9.super_ValueIteratorBase.isNull_;
      local_7c0 = (undefined1  [8])__end2.super_ValueIteratorBase._8_8_;
      cVar9 = Json::Value::end((Value *)__begin2.super_ValueIteratorBase._8_8_);
      local_7e0 = (undefined1  [8])cVar9.super_ValueIteratorBase.current_._M_node;
      __end2.super_ValueIteratorBase.current_._M_node._0_1_ = cVar9.super_ValueIteratorBase.isNull_;
      while( true ) {
        bVar1 = Json::ValueIteratorBase::operator!=
                          ((ValueIteratorBase *)local_7c0,(SelfType *)local_7e0);
        if (!bVar1) break;
        this = Json::ValueConstIterator::operator*((ValueConstIterator *)local_7c0);
        Json::Value::asString_abi_cxx11_((String *)((long)&export_info.Config.field_2 + 8),this);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&tdi_linked_target_dirs,(value_type *)((long)&export_info.Config.field_2 + 8)
                   );
        std::__cxx11::string::~string((string *)(export_info.Config.field_2._M_local_buf + 8));
        Json::ValueConstIterator::operator++((ValueConstIterator *)local_7c0);
      }
    }
    cmGlobalNinjaGenerator::CxxModuleExportInfo::CxxModuleExportInfo
              ((CxxModuleExportInfo *)local_930);
    pVVar6 = Json::Value::operator[]((Value *)&tdi,"config");
    Json::Value::asString_abi_cxx11_((String *)&tdi_exports,pVVar6);
    std::__cxx11::string::operator=
              ((string *)
               &export_info.Exports.
                super__Vector_base<CxxModuleExport,_std::allocator<CxxModuleExport>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(string *)&tdi_exports);
    std::__cxx11::string::~string((string *)&tdi_exports);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      std::__cxx11::string::operator=
                ((string *)
                 &export_info.Exports.
                  super__Vector_base<CxxModuleExport,_std::allocator<CxxModuleExport>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,"noconfig");
    }
    pVVar6 = Json::Value::operator[]((Value *)&tdi,"exports");
    bVar1 = Json::Value::isArray(pVVar6);
    if (bVar1) {
      __begin2_1.super_ValueIteratorBase._8_8_ = pVVar6;
      cVar9 = Json::Value::begin(pVVar6);
      __end2_1.super_ValueIteratorBase._8_8_ = cVar9.super_ValueIteratorBase.current_._M_node;
      __begin2_1.super_ValueIteratorBase.current_._M_node._0_1_ =
           cVar9.super_ValueIteratorBase.isNull_;
      local_970 = (undefined1  [8])__end2_1.super_ValueIteratorBase._8_8_;
      cVar9 = Json::Value::end((Value *)__begin2_1.super_ValueIteratorBase._8_8_);
      local_990 = (undefined1  [8])cVar9.super_ValueIteratorBase.current_._M_node;
      __end2_1.super_ValueIteratorBase.current_._M_node._0_1_ =
           cVar9.super_ValueIteratorBase.isNull_;
      while( true ) {
        bVar1 = Json::ValueIteratorBase::operator!=
                          ((ValueIteratorBase *)local_970,(SelfType *)local_990);
        if (!bVar1) break;
        exp._160_8_ = Json::ValueConstIterator::operator*((ValueConstIterator *)local_970);
        CxxModuleExport::CxxModuleExport((CxxModuleExport *)local_a50);
        pVVar6 = Json::Value::operator[]((Value *)exp._160_8_,"install");
        exp.Namespace.field_2._M_local_buf[8] = Json::Value::asBool(pVVar6);
        pVVar6 = Json::Value::operator[]((Value *)exp._160_8_,"export-name");
        Json::Value::asString_abi_cxx11_(&local_a70,pVVar6);
        std::__cxx11::string::operator=((string *)local_a50,(string *)&local_a70);
        std::__cxx11::string::~string((string *)&local_a70);
        pVVar6 = Json::Value::operator[]((Value *)exp._160_8_,"destination");
        Json::Value::asString_abi_cxx11_(&local_a90,pVVar6);
        std::__cxx11::string::operator=
                  ((string *)(exp.Name.field_2._M_local_buf + 8),(string *)&local_a90);
        std::__cxx11::string::~string((string *)&local_a90);
        pVVar6 = Json::Value::operator[]((Value *)exp._160_8_,"export-prefix");
        Json::Value::asString_abi_cxx11_(&local_ab0,pVVar6);
        std::__cxx11::string::operator=
                  ((string *)(exp.Destination.field_2._M_local_buf + 8),(string *)&local_ab0);
        std::__cxx11::string::~string((string *)&local_ab0);
        pVVar6 = Json::Value::operator[]((Value *)exp._160_8_,"cxx-module-info-dir");
        Json::Value::asString_abi_cxx11_(&local_ad0,pVVar6);
        std::__cxx11::string::operator=
                  ((string *)(exp.Prefix.field_2._M_local_buf + 8),(string *)&local_ad0);
        std::__cxx11::string::~string((string *)&local_ad0);
        pVVar6 = Json::Value::operator[]((Value *)exp._160_8_,"namespace");
        Json::Value::asString_abi_cxx11_((String *)&bmi_installation,pVVar6);
        std::__cxx11::string::operator=
                  ((string *)(exp.CxxModuleInfoDir.field_2._M_local_buf + 8),
                   (string *)&bmi_installation);
        std::__cxx11::string::~string((string *)&bmi_installation);
        std::vector<CxxModuleExport,_std::allocator<CxxModuleExport>_>::push_back
                  ((vector<CxxModuleExport,_std::allocator<CxxModuleExport>_> *)
                   &export_info.BmiInstallation.
                    super__Optional_base<CxxModuleBmiInstall,_false,_false>._M_payload.
                    super__Optional_payload<CxxModuleBmiInstall,_true,_false,_false>.
                    super__Optional_payload_base<CxxModuleBmiInstall>._M_engaged,
                   (value_type *)local_a50);
        CxxModuleExport::~CxxModuleExport((CxxModuleExport *)local_a50);
        Json::ValueConstIterator::operator++((ValueConstIterator *)local_970);
      }
    }
    bmi_install.ScriptLocation.field_2._8_8_ =
         Json::Value::operator[]((Value *)&tdi,"bmi-installation");
    bVar1 = Json::Value::isObject((Value *)bmi_install.ScriptLocation.field_2._8_8_);
    if (bVar1) {
      CxxModuleBmiInstall::CxxModuleBmiInstall((CxxModuleBmiInstall *)local_ba0);
      pVVar6 = Json::Value::operator[]
                         ((Value *)bmi_install.ScriptLocation.field_2._8_8_,"component");
      Json::Value::asString_abi_cxx11_(&local_bc0,pVVar6);
      std::__cxx11::string::operator=((string *)local_ba0,(string *)&local_bc0);
      std::__cxx11::string::~string((string *)&local_bc0);
      pVVar6 = Json::Value::operator[]
                         ((Value *)bmi_install.ScriptLocation.field_2._8_8_,"destination");
      Json::Value::asString_abi_cxx11_(&local_be0,pVVar6);
      std::__cxx11::string::operator=
                ((string *)(bmi_install.Component.field_2._M_local_buf + 8),(string *)&local_be0);
      std::__cxx11::string::~string((string *)&local_be0);
      pVVar6 = Json::Value::operator[]
                         ((Value *)bmi_install.ScriptLocation.field_2._8_8_,"exclude-from-all");
      bmi_install.Destination.field_2._M_local_buf[8] = Json::Value::asBool(pVVar6);
      pVVar6 = Json::Value::operator[]((Value *)bmi_install.ScriptLocation.field_2._8_8_,"optional")
      ;
      bmi_install.Destination.field_2._M_local_buf[9] = Json::Value::asBool(pVVar6);
      pVVar6 = Json::Value::operator[]
                         ((Value *)bmi_install.ScriptLocation.field_2._8_8_,"permissions");
      Json::Value::asString_abi_cxx11_(&local_c00,pVVar6);
      std::__cxx11::string::operator=((string *)&bmi_install.ExcludeFromAll,(string *)&local_c00);
      std::__cxx11::string::~string((string *)&local_c00);
      pVVar6 = Json::Value::operator[]
                         ((Value *)bmi_install.ScriptLocation.field_2._8_8_,"message-level");
      Json::Value::asString_abi_cxx11_(&local_c20,pVVar6);
      std::__cxx11::string::operator=
                ((string *)(bmi_install.Permissions.field_2._M_local_buf + 8),(string *)&local_c20);
      std::__cxx11::string::~string((string *)&local_c20);
      pVVar6 = Json::Value::operator[]
                         ((Value *)bmi_install.ScriptLocation.field_2._8_8_,"script-location");
      Json::Value::asString_abi_cxx11_((String *)&tdi_cxx_modules,pVVar6);
      std::__cxx11::string::operator=
                ((string *)(bmi_install.MessageLevel.field_2._M_local_buf + 8),
                 (string *)&tdi_cxx_modules);
      std::__cxx11::string::~string((string *)&tdi_cxx_modules);
      std::optional<CxxModuleBmiInstall>::operator=
                ((optional<CxxModuleBmiInstall> *)
                 &export_info.ObjectToFileSet._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (CxxModuleBmiInstall *)local_ba0);
      CxxModuleBmiInstall::~CxxModuleBmiInstall((CxxModuleBmiInstall *)local_ba0);
    }
    i.super_ValueIteratorBase._8_8_ = Json::Value::operator[]((Value *)&tdi,"cxx-modules");
    bVar1 = Json::Value::isObject((Value *)i.super_ValueIteratorBase._8_8_);
    if (bVar1) {
      cVar9 = Json::Value::begin((Value *)i.super_ValueIteratorBase._8_8_);
      local_c68 = (_Base_ptr)cVar9.super_ValueIteratorBase.current_._M_node;
      local_c60 = cVar9.super_ValueIteratorBase.isNull_;
      local_c58 = (undefined1  [8])local_c68;
      i.super_ValueIteratorBase.current_._M_node._0_1_ = local_c60;
      while( true ) {
        cVar9 = Json::Value::end((Value *)i.super_ValueIteratorBase._8_8_);
        fsi = (CxxModuleFileSet *)cVar9.super_ValueIteratorBase.current_._M_node;
        local_c80 = cVar9.super_ValueIteratorBase.isNull_;
        local_c78.current_._M_node = (_Base_ptr)fsi;
        local_c78.isNull_ = (bool)local_c80;
        bVar1 = Json::ValueIteratorBase::operator!=((ValueIteratorBase *)local_c58,&local_c78);
        if (!bVar1) break;
        Json::ValueIteratorBase::key((Value *)&tdi_cxx_module_info,(ValueIteratorBase *)local_c58);
        Json::Value::asString_abi_cxx11_(&local_cb0,(Value *)&tdi_cxx_module_info);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
                               *)local_930,&local_cb0);
        std::__cxx11::string::~string((string *)&local_cb0);
        Json::Value::~Value((Value *)&tdi_cxx_module_info);
        local_c90 = pmVar7;
        local_ce0 = Json::ValueConstIterator::operator*((ValueConstIterator *)local_c58);
        pVVar6 = Json::Value::operator[](local_ce0,"name");
        Json::Value::asString_abi_cxx11_(&local_d00,pVVar6);
        std::__cxx11::string::operator=((string *)local_c90,(string *)&local_d00);
        std::__cxx11::string::~string((string *)&local_d00);
        pVVar6 = Json::Value::operator[](local_ce0,"relative-directory");
        Json::Value::asString_abi_cxx11_(&local_d20,pVVar6);
        std::__cxx11::string::operator=
                  ((string *)&local_c90->RelativeDirectory,(string *)&local_d20);
        std::__cxx11::string::~string((string *)&local_d20);
        pVVar6 = Json::Value::operator[](local_ce0,"source");
        Json::Value::asString_abi_cxx11_(&local_d40,pVVar6);
        std::__cxx11::string::operator=((string *)&local_c90->SourcePath,(string *)&local_d40);
        std::__cxx11::string::~string((string *)&local_d40);
        pVVar6 = Json::Value::operator[](local_ce0,"type");
        Json::Value::asString_abi_cxx11_(&local_d60,pVVar6);
        std::__cxx11::string::operator=((string *)&local_c90->Type,(string *)&local_d60);
        std::__cxx11::string::~string((string *)&local_d60);
        pVVar6 = Json::Value::operator[](local_ce0,"visibility");
        Json::Value::asString_abi_cxx11_((String *)&tdi_fs_dest,pVVar6);
        sVar8 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&tdi_fs_dest);
        local_d70 = sVar8;
        cVar3 = cmFileSetVisibilityFromName(sVar8,(cmMakefile *)0x0);
        local_c90->Visibility = cVar3;
        std::__cxx11::string::~string((string *)&tdi_fs_dest);
        pVVar6 = Json::Value::operator[](local_ce0,"destination");
        bVar1 = Json::Value::isString(pVVar6);
        if (bVar1) {
          Json::Value::asString_abi_cxx11_((String *)&cm.ProfilingOutput,pVVar6);
          std::optional<std::__cxx11::string>::operator=
                    ((optional<std::__cxx11::string> *)&local_c90->Destination,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cm.ProfilingOutput);
          std::__cxx11::string::~string((string *)&cm.ProfilingOutput);
        }
        Json::ValueConstIterator::operator++((ValueConstIterator *)local_c58);
      }
    }
    cmake::cmake((cmake *)&ggd,RoleInternal,Unknown,Normal);
    cmake::SetHomeDirectory((cmake *)&ggd,(string *)((long)&module_dir.field_2 + 8));
    cmake::SetHomeOutputDirectory((cmake *)&ggd,(string *)((long)&dir_top_src.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1658,"Ninja",&local_1659);
    cmake::CreateGlobalGenerator((cmake *)local_1638,(string *)&ggd,SUB81(local_1658,0));
    std::__cxx11::string::~string(local_1658);
    std::allocator<char>::~allocator(&local_1659);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_1638);
    if (bVar1) {
      this_00 = ::cm::
                static_reference_cast<cmGlobalNinjaGenerator,_std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>,_0>
                          ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *
                           )local_1638);
      bVar1 = cmGlobalNinjaGenerator::WriteDyndepFile
                        (this_00,(string *)((long)&module_dir.field_2 + 8),
                         (string *)((long)&dir_top_src.field_2 + 8),
                         (string *)((long)&dir_top_bld.field_2 + 8),
                         (string *)((long)&dir_cur_src.field_2 + 8),
                         (string *)((long)&arg_lang.field_2 + 8),
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range1,(string *)local_778,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&tdi_linked_target_dirs,(string *)((long)&arg_tdi.field_2 + 8),
                         (string *)
                         &arg_ddis.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (CxxModuleExportInfo *)local_930);
      if (!bVar1) goto LAB_005d3a34;
      argBeg_local._M_current._4_4_ = 0;
    }
    else {
LAB_005d3a34:
      argBeg_local._M_current._4_4_ = 1;
    }
    local_274 = 1;
    std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
              ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)local_1638)
    ;
    cmake::~cmake((cmake *)&ggd);
    cmGlobalNinjaGenerator::CxxModuleExportInfo::~CxxModuleExportInfo
              ((CxxModuleExportInfo *)local_930);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&tdi_linked_target_dirs);
    std::__cxx11::string::~string((string *)local_778);
    std::__cxx11::string::~string((string *)(module_dir.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(dir_top_src.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(dir_top_bld.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(dir_cur_src.field_2._M_local_buf + 8));
  }
  Json::Value::~Value((Value *)&tdi);
LAB_005d3bc1:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  std::__cxx11::string::~string
            ((string *)
             &arg_ddis.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(arg_modmapfmt.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(arg_tdi.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(arg_lang.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return argBeg_local._M_current._4_4_;
}

Assistant:

int cmcmd_cmake_ninja_dyndep(std::vector<std::string>::const_iterator argBeg,
                             std::vector<std::string>::const_iterator argEnd)
{
  std::vector<std::string> arg_full =
    cmSystemTools::HandleResponseFile(argBeg, argEnd);

  std::string arg_dd;
  std::string arg_lang;
  std::string arg_tdi;
  std::string arg_modmapfmt;
  std::vector<std::string> arg_ddis;
  for (std::string const& arg : arg_full) {
    if (cmHasLiteralPrefix(arg, "--tdi=")) {
      arg_tdi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--lang=")) {
      arg_lang = arg.substr(7);
    } else if (cmHasLiteralPrefix(arg, "--dd=")) {
      arg_dd = arg.substr(5);
    } else if (cmHasLiteralPrefix(arg, "--modmapfmt=")) {
      arg_modmapfmt = arg.substr(12);
    } else if (!cmHasLiteralPrefix(arg, "--") &&
               cmHasLiteralSuffix(arg, ".ddi")) {
      arg_ddis.push_back(arg);
    } else {
      cmSystemTools::Error(
        cmStrCat("-E cmake_ninja_dyndep unknown argument: ", arg));
      return 1;
    }
  }
  if (arg_tdi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --tdi=");
    return 1;
  }
  if (arg_lang.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --lang=");
    return 1;
  }
  if (arg_dd.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --dd=");
    return 1;
  }

  Json::Value tdio;
  Json::Value const& tdi = tdio;
  {
    cmsys::ifstream tdif(arg_tdi.c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (!reader.parse(tdif, tdio, false)) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    arg_tdi,
                                    reader.getFormattedErrorMessages()));
      return 1;
    }
  }

  std::string const dir_cur_bld = tdi["dir-cur-bld"].asString();
  std::string const dir_cur_src = tdi["dir-cur-src"].asString();
  std::string const dir_top_bld = tdi["dir-top-bld"].asString();
  std::string const dir_top_src = tdi["dir-top-src"].asString();
  std::string module_dir = tdi["module-dir"].asString();
  if (!module_dir.empty() && !cmHasLiteralSuffix(module_dir, "/")) {
    module_dir += '/';
  }
  std::vector<std::string> linked_target_dirs;
  Json::Value const& tdi_linked_target_dirs = tdi["linked-target-dirs"];
  if (tdi_linked_target_dirs.isArray()) {
    for (auto const& tdi_linked_target_dir : tdi_linked_target_dirs) {
      linked_target_dirs.push_back(tdi_linked_target_dir.asString());
    }
  }

  cmGlobalNinjaGenerator::CxxModuleExportInfo export_info;
  export_info.Config = tdi["config"].asString();
  if (export_info.Config.empty()) {
    export_info.Config = "noconfig";
  }
  Json::Value const& tdi_exports = tdi["exports"];
  if (tdi_exports.isArray()) {
    for (auto const& tdi_export : tdi_exports) {
      CxxModuleExport exp;
      exp.Install = tdi_export["install"].asBool();
      exp.Name = tdi_export["export-name"].asString();
      exp.Destination = tdi_export["destination"].asString();
      exp.Prefix = tdi_export["export-prefix"].asString();
      exp.CxxModuleInfoDir = tdi_export["cxx-module-info-dir"].asString();
      exp.Namespace = tdi_export["namespace"].asString();

      export_info.Exports.push_back(exp);
    }
  }
  auto const& bmi_installation = tdi["bmi-installation"];
  if (bmi_installation.isObject()) {
    CxxModuleBmiInstall bmi_install;

    bmi_install.Component = bmi_installation["component"].asString();
    bmi_install.Destination = bmi_installation["destination"].asString();
    bmi_install.ExcludeFromAll = bmi_installation["exclude-from-all"].asBool();
    bmi_install.Optional = bmi_installation["optional"].asBool();
    bmi_install.Permissions = bmi_installation["permissions"].asString();
    bmi_install.MessageLevel = bmi_installation["message-level"].asString();
    bmi_install.ScriptLocation =
      bmi_installation["script-location"].asString();

    export_info.BmiInstallation = bmi_install;
  }
  Json::Value const& tdi_cxx_modules = tdi["cxx-modules"];
  if (tdi_cxx_modules.isObject()) {
    for (auto i = tdi_cxx_modules.begin(); i != tdi_cxx_modules.end(); ++i) {
      CxxModuleFileSet& fsi = export_info.ObjectToFileSet[i.key().asString()];
      auto const& tdi_cxx_module_info = *i;
      fsi.Name = tdi_cxx_module_info["name"].asString();
      fsi.RelativeDirectory =
        tdi_cxx_module_info["relative-directory"].asString();
      fsi.SourcePath = tdi_cxx_module_info["source"].asString();
      fsi.Type = tdi_cxx_module_info["type"].asString();
      fsi.Visibility = cmFileSetVisibilityFromName(
        tdi_cxx_module_info["visibility"].asString(), nullptr);
      auto const& tdi_fs_dest = tdi_cxx_module_info["destination"];
      if (tdi_fs_dest.isString()) {
        fsi.Destination = tdi_fs_dest.asString();
      }
    }
  }

  cmake cm(cmake::RoleInternal, cmState::Unknown);
  cm.SetHomeDirectory(dir_top_src);
  cm.SetHomeOutputDirectory(dir_top_bld);
  auto ggd = cm.CreateGlobalGenerator("Ninja");
  if (!ggd ||
      !cm::static_reference_cast<cmGlobalNinjaGenerator>(ggd).WriteDyndepFile(
        dir_top_src, dir_top_bld, dir_cur_src, dir_cur_bld, arg_dd, arg_ddis,
        module_dir, linked_target_dirs, arg_lang, arg_modmapfmt,
        export_info)) {
    return 1;
  }
  return 0;
}